

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O0

int fast_s_mp_mul_digs(mp_int *a,mp_int *b,mp_int *c,int digs)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int in_ECX;
  mp_int *in_RDX;
  int *in_RSI;
  int *in_RDI;
  mp_digit *tmpc;
  mp_digit *tmpy;
  mp_digit *tmpx;
  int iy;
  int ty;
  int tx;
  mp_word _W;
  mp_digit W [512];
  int iz;
  int ix;
  int pa;
  int res;
  int olduse;
  int in_stack_ffffffffffffef84;
  undefined4 in_stack_ffffffffffffef88;
  undefined4 in_stack_ffffffffffffef8c;
  ulong *local_1070;
  ulong *local_1068;
  ulong *local_1060;
  undefined1 local_1048 [16];
  ulong auStack_1038 [512];
  int local_38;
  int local_34;
  int local_30;
  undefined4 local_2c;
  int local_28;
  int local_24;
  mp_int *local_20;
  int *local_18;
  int *local_10;
  
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (in_RDX->alloc < in_ECX) {
    iVar4 = mp_grow((mp_int *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88),
                    in_stack_ffffffffffffef84);
    if (iVar4 != 0) {
      return iVar4;
    }
    local_2c = 0;
  }
  if (*local_10 + *local_18 <= local_24) {
    local_24 = *local_10 + *local_18;
  }
  local_1048 = ZEXT816(0);
  for (local_34 = 0; local_34 < local_24; local_34 = local_34 + 1) {
    iVar4 = local_34;
    if (*local_18 + -1 < local_34) {
      iVar4 = *local_18 + -1;
    }
    iVar5 = local_34 - iVar4;
    if (*local_10 - iVar5 < iVar4 + 1) {
      iVar6 = *local_10 - iVar5;
    }
    else {
      iVar6 = iVar4 + 1;
    }
    local_1068 = (ulong *)(*(long *)(local_18 + 4) + (long)iVar4 * 8);
    local_1060 = (ulong *)(*(long *)(local_10 + 4) + (long)iVar5 * 8);
    for (local_38 = 0; local_38 < iVar6; local_38 = local_38 + 1) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = *local_1060;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *local_1068;
      local_1048 = auVar1 * auVar2 + local_1048;
      local_1068 = local_1068 + -1;
      local_1060 = local_1060 + 1;
    }
    auStack_1038[local_34] = local_1048._0_8_ & 0xfffffffffffffff;
    uVar3 = local_1048._8_8_ << 4;
    local_1048._8_8_ = (ulong)local_1048._8_8_ >> 0x3c;
    local_1048._0_8_ = uVar3 | (ulong)local_1048._0_8_ >> 0x3c;
  }
  local_28 = local_20->used;
  local_20->used = local_24;
  local_1070 = local_20->dp;
  for (local_34 = 0; local_34 < local_24 + 1; local_34 = local_34 + 1) {
    *local_1070 = auStack_1038[local_34];
    local_1070 = local_1070 + 1;
  }
  for (; local_34 < local_28; local_34 = local_34 + 1) {
    *local_1070 = 0;
    local_1070 = local_1070 + 1;
  }
  local_30 = local_24;
  mp_clamp(local_20);
  return 0;
}

Assistant:

int fast_s_mp_mul_digs (mp_int * a, mp_int * b, mp_int * c, int digs)
{
  int     olduse, res, pa, ix, iz;
  mp_digit W[MP_WARRAY];
  register mp_word  _W;

  /* grow the destination as required */
  if (c->alloc < digs) {
    if ((res = mp_grow (c, digs)) != MP_OKAY) {
      return res;
    }
  }

  /* number of output digits to produce */
  pa = MIN(digs, a->used + b->used);

  /* clear the carry */
  _W = 0;
  for (ix = 0; ix < pa; ix++) { 
      int      tx, ty;
      int      iy;
      mp_digit *tmpx, *tmpy;

      /* get offsets into the two bignums */
      ty = MIN(b->used-1, ix);
      tx = ix - ty;

      /* setup temp aliases */
      tmpx = a->dp + tx;
      tmpy = b->dp + ty;

      /* this is the number of times the loop will iterrate, essentially 
         while (tx++ < a->used && ty-- >= 0) { ... }
       */
      iy = MIN(a->used-tx, ty+1);

      /* execute loop */
      for (iz = 0; iz < iy; ++iz) {
         _W += ((mp_word)*tmpx++)*((mp_word)*tmpy--);

      }

      /* store term */
      W[ix] = ((mp_digit)_W) & MP_MASK;

      /* make next carry */
      _W = _W >> ((mp_word)DIGIT_BIT);
 }

  /* setup dest */
  olduse  = c->used;
  c->used = pa;

  {
    register mp_digit *tmpc;
    tmpc = c->dp;
    for (ix = 0; ix < pa+1; ix++) {
      /* now extract the previous digit [below the carry] */
      *tmpc++ = W[ix];
    }

    /* clear unused digits [that existed in the old copy of c] */
    for (; ix < olduse; ix++) {
      *tmpc++ = 0;
    }
  }
  mp_clamp (c);
  return MP_OKAY;
}